

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# voxmerge.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  bool bVar1;
  int iVar2;
  
  if (argc < 3) {
    puts("ERROR: not enough arguments provided");
    print_help();
  }
  bVar1 = merge_scenes(argv[1],argv + 2,argc - 2);
  iVar2 = 99;
  if (bVar1) {
    iVar2 = 0;
  }
  return iVar2;
}

Assistant:

int main(int argc, const char** argv)
{
    if (argc <= 2) {
        printf("ERROR: not enough arguments provided\n");
        print_help();
    }
    // argv[0] = voxmerge.exe
    // argv[1] = output_filename
    // argv[2] = input file 0
    // argv[3] = input file 1
    if (merge_scenes(argv[1], &argv[2], argc-2)) {
        return 0;
    }

    // return an error code
    return 99;
}